

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  element_type *peVar1;
  pointer pbVar2;
  pointer ppVar3;
  bool bVar4;
  __type_conflict1 _Var5;
  int iVar6;
  const_reference __str;
  App *this_00;
  Option *this_01;
  Option *pOVar7;
  int64_t iVar8;
  int *piVar9;
  InvalidError *this_02;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  string *option_name;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer pbVar11;
  ulong uVar12;
  pointer ppVar13;
  allocator<char> local_291;
  string res;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&item->parents,level);
    ::std::__cxx11::string::string((string *)&local_50,__str);
    this_00 = get_subcommand_no_throw(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (this_00 == (App *)0x0) {
      return false;
    }
    bVar4 = _parse_single_config(this_00,item,level + 1);
    return bVar4;
  }
  psVar10 = &item->name;
  bVar4 = ::std::operator==(psVar10,"++");
  if (bVar4) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    _trigger_pre_parse(this,2);
    if (this->parent_ != (App *)0x0) {
      res._M_dataplus._M_p = (pointer)this;
      ::std::vector<CLI::App*,std::allocator<CLI::App*>>::emplace_back<CLI::App*>
                ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parent_->parsed_subcommands_,
                 (App **)&res);
      return true;
    }
    return true;
  }
  bVar4 = ::std::operator==(psVar10,"--");
  if (bVar4) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      _process_callbacks(this);
      _process_requirements(this);
      run_callback(this,false,false);
      return true;
    }
    return true;
  }
  ::std::operator+(&local_70,"--",psVar10);
  this_01 = get_option_no_throw(this,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  if (this_01 == (Option *)0x0) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_90,"-",psVar10);
      this_01 = get_option_no_throw(this,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (this_01 != (Option *)0x0) {
        if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
          option_name = &local_d0;
          goto LAB_0017da44;
        }
        goto LAB_0017daa3;
      }
    }
    ::std::__cxx11::string::string((string *)&local_b0,psVar10);
    this_01 = get_option_no_throw(this,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    if (this_01 == (Option *)0x0) {
      if (this->allow_config_extras_ != capture) {
        return false;
      }
      local_268._M_dataplus._M_p._0_4_ = 0;
      ConfigItem::fullname_abi_cxx11_(&res,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)&local_268,&res);
      ::std::__cxx11::string::~string((string *)&res);
      pbVar2 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = (item->inputs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
          pbVar11 = pbVar11 + 1) {
        res._M_dataplus._M_p = res._M_dataplus._M_p & 0xffffffff00000000;
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&this->missing_,(Classifier *)&res,pbVar11);
      }
      return false;
    }
  }
  else if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_f0,"-",psVar10);
      pOVar7 = get_option_no_throw(this,&local_f0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      if ((pOVar7 != (Option *)0x0) &&
         ((pOVar7->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_01 = pOVar7;
      }
    }
    if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
      option_name = &local_110;
LAB_0017da44:
      ::std::__cxx11::string::string((string *)option_name,psVar10);
      pOVar7 = get_option_no_throw(this,option_name);
      ::std::__cxx11::string::~string((string *)option_name);
      if ((pOVar7 != (Option *)0x0) &&
         ((pOVar7->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_01 = pOVar7;
      }
    }
  }
LAB_0017daa3:
  if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_170,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_170);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_01->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  if (this_01->expected_min_ != 0) {
LAB_0017dac9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_248,&item->inputs);
    Option::add_result(this_01,&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    Option::run_callback(this_01);
    return true;
  }
  uVar12 = (long)(item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (1 < uVar12) {
    iVar6 = Option::get_items_expected_max(this_01);
    if ((iVar6 < (int)uVar12) &&
       ((this_01->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      iVar6 = Option::get_items_expected_max(this_01);
      if (1 < iVar6) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        iVar6 = Option::get_items_expected_max(this_01);
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_190,iVar6,
                   (long)(item->inputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(item->inputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_01->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_1b0,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_1b0);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar11 = (item->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pbVar11 == pbVar2) {
          return true;
        }
        ppVar13 = (this_01->default_flag_values_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = (this_01->default_flag_values_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar13 == ppVar3) {
          bVar4 = ::std::operator==(pbVar11,"true");
          if ((((!bVar4) && (bVar4 = ::std::operator==(pbVar11,"false"), !bVar4)) &&
              (bVar4 = ::std::operator==(pbVar11,"1"), !bVar4)) &&
             (bVar4 = ::std::operator==(pbVar11,"0"), !bVar4)) {
LAB_0017dded:
            this_02 = (InvalidError *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"invalid flag argument given",(allocator<char> *)&res);
            InvalidError::InvalidError(this_02,&local_1d0);
            __cxa_throw(this_02,&InvalidError::typeinfo,Error::~Error);
          }
        }
        else {
          do {
            if (ppVar13 == ppVar3) goto LAB_0017dded;
            _Var5 = ::std::operator==(&ppVar13->second,pbVar11);
            ppVar13 = ppVar13 + 1;
          } while (!_Var5);
        }
        ::std::__cxx11::string::string((string *)&local_150,pbVar11);
        Option::add_result(this_01,&local_150);
        ::std::__cxx11::string::~string((string *)&local_150);
        pbVar11 = pbVar11 + 1;
      } while( true );
    }
    goto LAB_0017dac9;
  }
  peVar1 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_Config[2])(&res,peVar1,item);
  if ((this_01->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
    ::std::__cxx11::string::string((string *)&local_130,&res);
    iVar8 = detail::to_flag_value(&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    if (iVar8 != 1) goto LAB_0017dd41;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"{}",&local_291);
    Option::get_flag_value(&local_268,this_01,psVar10,&local_1f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&res,&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    psVar10 = &local_1f0;
  }
  else {
LAB_0017dd41:
    piVar9 = __errno_location();
    *piVar9 = 0;
    bVar4 = ::std::operator==(&res,"{}");
    if ((bVar4) && (1 < this_01->expected_max_)) goto LAB_0017ddb8;
    ::std::__cxx11::string::string((string *)&local_210,&res);
    Option::get_flag_value(&local_268,this_01,psVar10,&local_210);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&res,&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    psVar10 = &local_210;
  }
  ::std::__cxx11::string::~string((string *)psVar10);
LAB_0017ddb8:
  ::std::__cxx11::string::string((string *)&local_230,&res);
  Option::add_result(this_01,&local_230);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::__cxx11::string::~string((string *)&res);
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }

    if(op->empty()) {

        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(item.inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), item.inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : item.inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(item.inputs);
        op->run_callback();
    }

    return true;
}